

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void C_BackupCVars(void)

{
  uint uVar1;
  int iVar2;
  char *copyStr;
  undefined4 extraout_var;
  FBaseCVar *local_20;
  FBaseCVar *cvar;
  FCVarBackup backup;
  
  uVar1 = TArray<FCVarBackup,_FCVarBackup>::Size(&CVarBackups);
  if (uVar1 == 0) {
    TArray<FCVarBackup,_FCVarBackup>::Clear(&CVarBackups);
    FCVarBackup::FCVarBackup((FCVarBackup *)&cvar);
    for (local_20 = CVars; local_20 != (FBaseCVar *)0x0; local_20 = local_20->m_Next) {
      if (((local_20->Flags & 0x44) != 0) && ((local_20->Flags & 0x10) == 0)) {
        copyStr = FBaseCVar::GetName(local_20);
        FString::operator=((FString *)&cvar,copyStr);
        iVar2 = (*local_20->_vptr_FBaseCVar[4])(local_20,3);
        FString::operator=(&backup.Name,(char *)CONCAT44(extraout_var,iVar2));
        TArray<FCVarBackup,_FCVarBackup>::Push(&CVarBackups,(FCVarBackup *)&cvar);
      }
    }
    FCVarBackup::~FCVarBackup((FCVarBackup *)&cvar);
    return;
  }
  __assert_fail("CVarBackups.Size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                ,0x588,"void C_BackupCVars()");
}

Assistant:

void C_BackupCVars (void)
{
	assert(CVarBackups.Size() == 0);
	CVarBackups.Clear();

	FCVarBackup backup;

	for (FBaseCVar *cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
	{
		if ((cvar->Flags & (CVAR_SERVERINFO|CVAR_DEMOSAVE)) && !(cvar->Flags & CVAR_LATCH))
		{
			backup.Name = cvar->GetName();
			backup.String = cvar->GetGenericRep(CVAR_String).String;
			CVarBackups.Push(backup);
		}
	}
}